

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

QSslConfiguration QSslConfigurationPrivate::defaultDtlsConfiguration(void)

{
  QSslConfigurationPrivate *pQVar1;
  Type *pTVar2;
  QSharedDataPointer<QSslConfigurationPrivate> in_RDI;
  QSharedDataPointer<QSslConfigurationPrivate> this;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *this_00;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
            local_28;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this.d.ptr = in_RDI.d.ptr;
  QSslSocketPrivate::ensureInitialized();
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)this.d.ptr);
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,&pTVar2->mutex);
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()(this_00);
  pQVar1 = (pTVar2->dtlsConfig).d.ptr;
  *(QSslConfigurationPrivate **)in_RDI.d.ptr = pQVar1;
  if (pQVar1 != (QSslConfigurationPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSharedDataPointer<QSslConfigurationPrivate>)
           (QSharedDataPointer<QSslConfigurationPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QSslConfiguration QSslConfigurationPrivate::defaultDtlsConfiguration()
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);

    return QSslConfiguration(globalData()->dtlsConfig.data());
}